

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLgraph.c
# Opt level: O3

void RDL_printGraph(RDL_graph *graph)

{
  ulong uVar1;
  ulong uVar2;
  
  printf("|V|=%d, |E|=%d\n",(ulong)graph->V,(ulong)graph->E);
  if (graph->V != 0) {
    uVar1 = 0;
    do {
      printf("%d:  ",uVar1 & 0xffffffff);
      if (graph->degree[uVar1] != 0) {
        uVar2 = 0;
        do {
          printf("%d ",(ulong)graph->adjList[uVar1][uVar2][0]);
          uVar2 = uVar2 + 1;
        } while (uVar2 < graph->degree[uVar1]);
      }
      putchar(10);
      uVar1 = uVar1 + 1;
    } while (uVar1 < graph->V);
  }
  if (graph->edges != (uint **)0x0) {
    puts("edges:");
    if (graph->E != 0) {
      uVar1 = 0;
      do {
        printf("%d: [%d,%d]\n",uVar1 & 0xffffffff,(ulong)*graph->edges[uVar1],
               (ulong)graph->edges[uVar1][1]);
        uVar1 = uVar1 + 1;
      } while (uVar1 < graph->E);
    }
  }
  return;
}

Assistant:

void RDL_printGraph(const RDL_graph *graph)
{
  unsigned i,j;

  printf("|V|=%d, |E|=%d\n",graph->V,graph->E);
  for(i=0; i<graph->V; ++i)
  {
    printf("%d:  ",i);
    for(j=0; j<graph->degree[i]; ++j)
    {
      printf("%d ",graph->adjList[i][j][0]);
    }
    printf("\n");
  }
  if(graph->edges)/*undirected*/
  {
    printf("edges:\n");
    for(i=0; i<graph->E; ++i)
    {
      printf("%d: [%d,%d]\n", i, graph->edges[i][0], graph->edges[i][1]);
    }
  }
}